

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  int top;
  int left;
  ulong _elemsize;
  int *piVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  Option *pOVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  void *__dest;
  void *__src;
  Mat m;
  void *ptr;
  Mat local_118;
  undefined1 *local_d8;
  Option *local_d0;
  long local_c8;
  int local_c0;
  int local_bc;
  Mat local_b8;
  Mat local_78;
  Mat *local_38;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar8 = this->outw;
  if (iVar8 == -0xea) {
    iVar12 = ~this->woffset + uVar1;
  }
  else {
    iVar12 = uVar1 - this->woffset;
    if ((iVar8 != -0xe9) && (iVar8 <= iVar12)) {
      iVar12 = iVar8;
    }
  }
  uVar3 = bottom_blob->c;
  local_d8 = (undefined1 *)(ulong)uVar3;
  iVar8 = this->outh;
  if (iVar8 == -0xea) {
    iVar13 = uVar2 + ~this->hoffset;
  }
  else {
    iVar13 = uVar2 - this->hoffset;
    if ((iVar8 != -0xe9) && (iVar8 <= iVar13)) {
      iVar13 = iVar8;
    }
  }
  uVar4 = this->outc;
  if (uVar4 == 0xffffff16) {
    local_b8.c = ~this->coffset + uVar3;
  }
  else {
    local_b8.c = uVar3 - this->coffset;
    if ((uVar4 != 0xffffff17) && ((int)uVar4 <= local_b8.c)) {
      local_b8.c = uVar4;
    }
  }
  iVar8 = bottom_blob->dims;
  _elemsize = bottom_blob->elemsize;
  if ((iVar13 == uVar2 && iVar12 == uVar1) && (local_b8.c == uVar3)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar5 = bottom_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = top_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar5 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar5;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->packing = bottom_blob->packing;
    top_blob->allocator = bottom_blob->allocator;
    iVar8 = bottom_blob->w;
    iVar12 = bottom_blob->h;
    iVar13 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar8;
    top_blob->h = iVar12;
    top_blob->c = iVar13;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  local_c8 = CONCAT44(local_c8._4_4_,iVar12);
  local_b8.data =
       (void *)((long)this->coffset * _elemsize * bottom_blob->cstep + (long)bottom_blob->data);
  local_b8.packing = bottom_blob->packing;
  local_b8.allocator = bottom_blob->allocator;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = (undefined4)_elemsize;
  local_b8.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_b8.dims = 3;
  uVar9 = (long)(int)(uVar2 * uVar1) * _elemsize + 0xf & 0xfffffffffffffff0;
  local_b8.cstep = uVar9 / _elemsize;
  local_b8.w = uVar1;
  local_b8.h = uVar2;
  if (iVar13 == uVar2 && iVar12 == uVar1) {
    if ((bottom_blob->data == (void *)0x0) || ((long)local_b8.c * local_b8.cstep == 0)) {
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.packing = 0;
      local_118.data = (void *)0x0;
      local_118.refcount = (int *)0x0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.c = 0;
      local_118.cstep = 0;
    }
    else {
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.packing = 0;
      local_118.data = (void *)0x0;
      local_118.refcount = (int *)0x0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.c = 0;
      local_118.cstep = 0;
      auVar7._4_4_ = -(uint)(uVar2 == 0);
      auVar7._0_4_ = -(uint)(uVar1 == 0);
      auVar7._8_4_ = -(uint)(local_b8.c == 0);
      auVar7._12_4_ = 0;
      iVar12 = movmskps((int)(uVar9 % _elemsize),auVar7 << 0x20);
      if (((iVar12 != 0xf) || (local_b8.packing != 0)) || (_elemsize != 0)) {
        local_b8.dims = 3;
        local_b8.refcount._4_4_ = 0;
        local_b8.refcount._0_4_ = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 3;
        uVar9 = (long)local_b8.c * local_b8.cstep * _elemsize + 3 & 0xfffffffffffffffc;
        local_78.data = (void *)0x0;
        local_118.elemsize._0_4_ = (undefined4)local_b8.elemsize;
        local_118.elemsize._4_4_ = local_b8.elemsize._4_4_;
        local_118.packing = local_b8.packing;
        local_118.w = uVar1;
        local_118.h = uVar2;
        local_118.c = local_b8.c;
        local_118.cstep = local_b8.cstep;
        local_d0 = opt;
        local_c0 = iVar8;
        local_bc = iVar13;
        iVar8 = posix_memalign(&local_78.data,0x10,uVar9 + 4);
        if (iVar8 != 0) {
          local_78.data = (void *)0x0;
        }
        local_118.data = local_78.data;
        local_118.refcount = (int *)((long)local_78.data + uVar9);
        *(undefined4 *)((long)local_78.data + uVar9) = 1;
        opt = local_d0;
        iVar13 = local_bc;
        iVar8 = local_c0;
      }
      if ((long)local_b8.c * local_b8.cstep != 0) {
        memcpy(local_118.data,local_b8.data,
               (long)local_b8.c * local_b8.cstep *
               CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
      }
    }
    if (&local_118 != top_blob) {
      if (local_118.refcount != (int *)0x0) {
        LOCK();
        *local_118.refcount = *local_118.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = local_118.data;
      top_blob->refcount = local_118.refcount;
      top_blob->elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
      top_blob->packing = local_118.packing;
      top_blob->allocator = local_118.allocator;
      top_blob->dims = local_118.dims;
      top_blob->w = local_118.w;
      top_blob->h = local_118.h;
      top_blob->c = local_118.c;
      top_blob->cstep = local_118.cstep;
    }
    if (local_118.refcount != (int *)0x0) {
      LOCK();
      *local_118.refcount = *local_118.refcount + -1;
      UNLOCK();
      if (*local_118.refcount == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (**(code **)(*(long *)local_118.allocator + 0x18))();
        }
      }
    }
    iVar12 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_001386d1;
  }
  top = this->hoffset;
  left = this->woffset;
  if (iVar8 == 3) {
    Mat::create(top_blob,(int)local_c8,iVar13,(int)local_d8,_elemsize,opt->blob_allocator);
    iVar12 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_001386d1;
    iVar12 = 0;
    if ((int)local_d8 < 1) goto LAB_001386d1;
    pOVar10 = (Option *)0x0;
    local_38 = top_blob;
    do {
      local_118.data =
           (void *)(local_b8.cstep * (long)pOVar10 *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) +
                   (long)local_b8.data);
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = (undefined4)local_b8.elemsize;
      local_118.elemsize._4_4_ = local_b8.elemsize._4_4_;
      local_118.packing = local_b8.packing;
      local_118.allocator = local_b8.allocator;
      local_118.dims = 2;
      local_118.w = local_b8.w;
      local_118.h = local_b8.h;
      local_118.c = 1;
      local_118.cstep = (size_t)(local_b8.h * local_b8.w);
      uVar3 = top_blob->w;
      iVar8 = top_blob->h;
      sVar6 = top_blob->elemsize;
      __dest = (void *)(top_blob->cstep * (long)pOVar10 * sVar6 + (long)top_blob->data);
      local_78.packing = top_blob->packing;
      local_78.allocator = top_blob->allocator;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = (undefined4)sVar6;
      local_78.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
      local_78.w = uVar3;
      local_78.dims = 2;
      local_78.c = 1;
      local_78.h = iVar8;
      local_78.cstep = (size_t)(int)(iVar8 * uVar3);
      local_d0 = pOVar10;
      local_78.data = __dest;
      if (_elemsize == 4) {
        copy_cut_border_image<float>(&local_118,&local_78,top,left);
      }
      else if ((_elemsize == 1) && (0 < iVar8)) {
        __src = (void *)((long)local_118.data +
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                        (long)(local_b8.w * top) + (long)left);
        lVar11 = (long)local_b8.w;
        iVar12 = 0;
        local_c8 = lVar11;
        do {
          if ((int)uVar3 < 0xc) {
            if (0 < (int)uVar3) {
              uVar9 = 0;
              do {
                *(undefined1 *)((long)__dest + uVar9) = *(undefined1 *)((long)__src + uVar9);
                uVar9 = uVar9 + 1;
              } while (uVar3 != uVar9);
            }
          }
          else {
            memcpy(__dest,__src,(ulong)uVar3);
            lVar11 = local_c8;
          }
          __dest = (void *)((long)__dest + (long)(int)uVar3);
          __src = (void *)((long)__src + lVar11);
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar8);
      }
      piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (**(code **)(*(long *)local_78.allocator + 0x18))();
          }
        }
      }
      top_blob = local_38;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.packing = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.c = 0;
      local_78.cstep = 0;
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (**(code **)(*(long *)local_118.allocator + 0x18))();
          }
        }
      }
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.packing = 0;
      local_118.data = (void *)0x0;
      local_118.refcount = (int *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.c = 0;
      local_118.cstep = 0;
      pOVar10 = (Option *)&local_d0->field_0x1;
    } while (pOVar10 != (Option *)local_d8);
  }
  else if (iVar8 == 2) {
    Mat::create(top_blob,iVar13,iVar13,_elemsize,opt->blob_allocator);
    iVar12 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_001386d1;
    if (_elemsize == 4) {
      copy_cut_border_image<float>(&local_b8,top_blob,top,left);
    }
    else if (_elemsize == 1) {
      copy_cut_border_image<signed_char>(&local_b8,top_blob,top,left);
    }
  }
  iVar12 = 0;
LAB_001386d1:
  piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  return iVar12;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _outw;
    int _outh;
    int _outc;

    if (outw == -233)
        _outw = w - woffset;
    else if (outw == -234)
        _outw = w - 1 - woffset;
    else
        _outw = std::min(outw, w - woffset);

    if (outh == -233)
        _outh = h - hoffset;
    else if (outh == -234)
        _outh = h - 1 - hoffset;
    else
        _outh = std::min(outh, h - hoffset);

    if (outc == -233)
        _outc = channels - coffset;
    else if (outc == -234)
        _outc = channels - 1 - coffset;
    else
        _outc = std::min(outc, channels - coffset);

    if (_outw == w && _outh == h && _outc == channels)
    {
        top_blob = bottom_blob;
        return 0;
    }

    const Mat bottom_blob_sliced = bottom_blob.channel_range(coffset, _outc);

    if (_outw == w && _outh == h)
    {
        top_blob = bottom_blob_sliced.clone();
        if (top_blob.empty())
            return -100;
    }

    int top = hoffset;
    int left = woffset;

    if (dims == 2)
    {
        top_blob.create(_outh, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob_sliced, top_blob, top, left);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob_sliced, top_blob, top, left);
    }

    if (dims == 3)
    {
        top_blob.create(_outw, _outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, top, left);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, top, left);
        }
    }

    return 0;
}